

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::ExtrasError::~ExtrasError(ExtrasError *this)

{
  void *in_RDI;
  
  ~ExtrasError((ExtrasError *)0x172638);
  operator_delete(in_RDI);
  return;
}

Assistant:

explicit ExtrasError(std::vector<std::string> args)
        : ExtrasError((args.size() > 1 ? "The following arguments were not expected: "
                                       : "The following argument was not expected: ") +
                          detail::rjoin(args, " "),
                      ExitCodes::ExtrasError) {}